

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsChartElement.cpp
# Opt level: O1

void __thiscall KDReports::ChartElement::ChartElement(ChartElement *this,QString *modelKey)

{
  QSharedDataPointer<KDReports::ChartElementPrivate> *this_00;
  ChartElementPrivate *pCVar1;
  QAbstractItemModel *pQVar2;
  
  Element::Element(&this->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__ChartElement_00174178;
  pCVar1 = (ChartElementPrivate *)operator_new(0x28);
  this_00 = &this->d;
  (pCVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  pCVar1->m_tableModel = (QAbstractItemModel *)0x0;
  (pCVar1->m_size).wd = 100.0;
  (pCVar1->m_size).ht = 100.0;
  pCVar1->m_unit = Millimeters;
  pCVar1->m_deleteChart = false;
  this_00->d = pCVar1;
  LOCK();
  (pCVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pCVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if ((modelKey->d).size != 0) {
    pQVar2 = modelForKey(modelKey);
    if ((this_00->d != (ChartElementPrivate *)0x0) &&
       ((this_00->d->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
        ._q_value.super___atomic_base<int>._M_i != 1)) {
      QSharedDataPointer<KDReports::ChartElementPrivate>::detach_helper(this_00);
    }
    this_00->d->m_tableModel = pQVar2;
  }
  return;
}

Assistant:

KDReports::ChartElement::ChartElement(const QString &modelKey)
    : d(new ChartElementPrivate)
{
    if (!modelKey.isEmpty())
        d->m_tableModel = KDReports::modelForKey(modelKey);
}